

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svd22.c
# Opt level: O0

void svd22(double *A,double *U,double *S,double *V)

{
  double dVar1;
  double dVar2;
  double __y;
  double dVar3;
  double dVar4;
  double dVar5;
  double __x;
  double dVar6;
  double dVar7;
  double dVar8;
  double tmp [2];
  double f;
  double e;
  double C1;
  double SPpT;
  double CPpT;
  double C0;
  double SPmT;
  double CPmT;
  double ST;
  double CT;
  double SP;
  double CP;
  double T;
  double P;
  double PplusT;
  double PminusT;
  double B3;
  double B2;
  double B1;
  double B0;
  double A11;
  double A10;
  double A01;
  double A00;
  double *V_local;
  double *S_local;
  double *U_local;
  double *A_local;
  
  dVar1 = *A + A[3];
  dVar2 = *A - A[3];
  __y = A[1] + A[2];
  dVar3 = A[1] - A[2];
  dVar4 = atan2(dVar3,dVar1);
  dVar5 = atan2(__y,dVar2);
  __x = (dVar4 + dVar5) / 2.0;
  dVar4 = (-dVar4 + dVar5) / 2.0;
  dVar5 = cos(__x);
  dVar6 = sin(__x);
  dVar7 = cos(dVar4);
  dVar8 = sin(dVar4);
  *U = dVar7;
  U[1] = -dVar8;
  U[2] = dVar8;
  U[3] = dVar7;
  *V = dVar5;
  V[1] = -dVar6;
  V[2] = dVar6;
  V[3] = dVar5;
  dVar5 = cos(__x - dVar4);
  dVar6 = sin(__x - dVar4);
  if (ABS(dVar5) <= ABS(dVar6)) {
    CPpT = dVar3 / dVar6;
  }
  else {
    CPpT = dVar1 / dVar5;
  }
  dVar1 = cos(__x + dVar4);
  dVar3 = sin(__x + dVar4);
  if (ABS(dVar1) <= ABS(dVar3)) {
    e = __y / dVar3;
  }
  else {
    e = dVar2 / dVar1;
  }
  f = (CPpT + e) / 2.0;
  tmp[1] = (CPpT - e) / 2.0;
  if (f < 0.0) {
    f = -f;
    *U = -*U;
    U[2] = -U[2];
  }
  if (tmp[1] < 0.0) {
    tmp[1] = -tmp[1];
    U[1] = -U[1];
    U[3] = -U[3];
  }
  if (f <= tmp[1]) {
    *S = tmp[1];
    S[1] = f;
    dVar1 = *U;
    dVar2 = U[2];
    *U = U[1];
    U[2] = U[3];
    U[1] = dVar1;
    U[3] = dVar2;
    dVar1 = *V;
    dVar2 = V[2];
    *V = V[1];
    V[2] = V[3];
    V[1] = dVar1;
    V[3] = dVar2;
  }
  else {
    *S = f;
    S[1] = tmp[1];
  }
  return;
}

Assistant:

void svd22(const double A[4], double U[4], double S[2], double V[4])
{
    double A00 = A[0];
    double A01 = A[1];
    double A10 = A[2];
    double A11 = A[3];

    double B0 = A00 + A11;
    double B1 = A00 - A11;
    double B2 = A01 + A10;
    double B3 = A01 - A10;

    double PminusT = atan2(B3, B0);
    double PplusT = atan2(B2, B1);

    double P = (PminusT + PplusT) / 2;
    double T = (-PminusT + PplusT) / 2;

    double CP = cos(P), SP = sin(P);
    double CT = cos(T), ST = sin(T);

    U[0] = CT;
    U[1] = -ST;
    U[2] = ST;
    U[3] = CT;

    V[0] = CP;
    V[1] = -SP;
    V[2] = SP;
    V[3] = CP;

    // C0 = e+f. There are two ways to compute C0; we pick the one
    // that is better conditioned.
    double CPmT = cos(P-T), SPmT = sin(P-T);
    double C0 = 0;
    if (fabs(CPmT) > fabs(SPmT))
        C0 = B0 / CPmT;
    else
        C0 = B3 / SPmT;

    // C1 = e-f. There are two ways to compute C1; we pick the one
    // that is better conditioned.
    double CPpT = cos(P+T), SPpT = sin(P+T);
    double C1 = 0;
    if (fabs(CPpT) > fabs(SPpT))
        C1 = B1 / CPpT;
    else
        C1 = B2 / SPpT;

    // e and f are the singular values
    double e = (C0 + C1) / 2;
    double f = (C0 - C1) / 2;

    if (e < 0) {
        e = -e;
        U[0] = -U[0];
        U[2] = -U[2];
    }

    if (f < 0) {
        f = -f;
        U[1] = -U[1];
        U[3] = -U[3];
    }

    // sort singular values.
    if (e > f) {
        // already in big-to-small order.
        S[0] = e;
        S[1] = f;
    } else {
        // Curiously, this code never seems to get invoked.  Why is it
        // that S[0] always ends up the dominant vector?  However,
        // this code has been tested (flipping the logic forces us to
        // sort the singular values in ascending order).
        //
        // P = [ 0 1 ; 1 0 ]
        // USV' = (UP)(PSP)(PV')
        //      = (UP)(PSP)(VP)'
        //      = (UP)(PSP)(P'V')'
        S[0] = f;
        S[1] = e;

        // exchange columns of U and V
        double tmp[2];
        tmp[0] = U[0];
        tmp[1] = U[2];
        U[0] = U[1];
        U[2] = U[3];
        U[1] = tmp[0];
        U[3] = tmp[1];

        tmp[0] = V[0];
        tmp[1] = V[2];
        V[0] = V[1];
        V[2] = V[3];
        V[1] = tmp[0];
        V[3] = tmp[1];
    }

    /*
    double SM[4] = { S[0], 0, 0, S[1] };

    doubles_print_mat(U, 2, 2, "%20.10g");
    doubles_print_mat(SM, 2, 2, "%20.10g");
    doubles_print_mat(V, 2, 2, "%20.10g");
    printf("A:\n");
    doubles_print_mat(A, 2, 2, "%20.10g");

    double SVt[4];
    doubles_mat_ABt(SM, 2, 2, V, 2, 2, SVt, 2, 2);
    double USVt[4];
    doubles_mat_AB(U, 2, 2, SVt, 2, 2, USVt, 2, 2);

    printf("USVt\n");
    doubles_print_mat(USVt, 2, 2, "%20.10g");

    double diff[4];
    for (int i = 0; i < 4; i++)
        diff[i] = A[i] - USVt[i];

    printf("diff\n");
    doubles_print_mat(diff, 2, 2, "%20.10g");

    */

}